

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word Gia_LutComputeTruth6Map_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vMap)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Man_t *local_78;
  ulong local_70;
  ulong local_68;
  Gia_Obj_t *pObj;
  word Truth;
  word Truth1;
  word Truth0;
  Vec_Int_t *vMap_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  iVar1 = Gia_ObjIsConst0(pObj_00);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      local_68 = Gia_LutComputeTruth6Map_rec(p,iVar1,vMap);
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      local_70 = Gia_LutComputeTruth6Map_rec(p,iVar1,vMap);
      iVar1 = Gia_ObjFaninC0(pObj_00);
      if (iVar1 != 0) {
        local_68 = local_68 ^ 0xffffffffffffffff;
      }
      iVar1 = Gia_ObjFaninC1(pObj_00);
      if (iVar1 != 0) {
        local_70 = local_70 ^ 0xffffffffffffffff;
      }
      iVar1 = Gia_ObjIsXor(pObj_00);
      if (iVar1 == 0) {
        local_78 = (Gia_Man_t *)(local_68 & local_70);
      }
      else {
        local_78 = (Gia_Man_t *)(local_68 ^ local_70);
      }
      p_local = local_78;
    }
    else {
      iVar1 = Gia_ObjCioId(pObj_00);
      iVar1 = Vec_IntEntry(vMap,iVar1);
      p_local = (Gia_Man_t *)s_Truths6[iVar1];
    }
  }
  else {
    p_local = (Gia_Man_t *)0x0;
  }
  return (word)p_local;
}

Assistant:

word Gia_LutComputeTruth6Map_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vMap )
{
    word Truth0, Truth1, Truth;
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( Gia_ObjIsConst0(pObj) )
        return 0;
    if ( Gia_ObjIsCi(pObj) )
        return s_Truths6[Vec_IntEntry(vMap, Gia_ObjCioId(pObj))];
    Truth0 = Gia_LutComputeTruth6Map_rec( p, Gia_ObjFaninId0(pObj, iObj), vMap );
    Truth1 = Gia_LutComputeTruth6Map_rec( p, Gia_ObjFaninId1(pObj, iObj), vMap );
    Truth0 = Gia_ObjFaninC0(pObj) ? ~Truth0 : Truth0;
    Truth1 = Gia_ObjFaninC1(pObj) ? ~Truth1 : Truth1;
    Truth  = Gia_ObjIsXor(pObj) ? Truth0 ^ Truth1 : Truth0 & Truth1;
    return Truth;
}